

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

u32 jsonTranslateBlobToText(JsonParse *pParse,u32 i,JsonString *pOut)

{
  byte *pbVar1;
  byte bVar2;
  u8 uVar3;
  ulong uVar4;
  long lVar5;
  u32 uVar6;
  int iVar7;
  char cVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  char *pcVar13;
  u32 uVar14;
  uint uVar15;
  u8 *puVar16;
  byte *zIn;
  u32 uVar17;
  bool bVar18;
  u32 sz;
  u32 local_44;
  ulong local_40;
  ulong local_38;
  
  uVar9 = (ulong)i;
  uVar6 = jsonbPayloadSize(pParse,i,&local_44);
  uVar17 = local_44;
  if (uVar6 == 0) {
    pOut->eErr = pOut->eErr | 2;
    return pParse->nBlob + 1;
  }
  puVar16 = pParse->aBlob;
  switch(puVar16[uVar9] & 0xf) {
  case 0:
    pcVar13 = "null";
    goto LAB_001ab4ce;
  case 1:
    pcVar13 = "true";
LAB_001ab4ce:
    uVar17 = 4;
LAB_001ab4d6:
    jsonAppendRawNZ(pOut,pcVar13,uVar17);
    return i + 1;
  case 2:
    pcVar13 = "false";
    uVar17 = 5;
    goto LAB_001ab4d6;
  case 3:
  case 5:
    if (local_44 != 0) {
      jsonAppendRaw(pOut,(char *)(puVar16 + (uVar6 + i)),local_44);
      goto LAB_001abb87;
    }
    break;
  case 4:
    if (local_44 != 0) {
      uVar3 = puVar16[uVar6 + i];
      if (uVar3 == '+') {
LAB_001abac0:
        uVar15 = 3;
      }
      else {
        uVar15 = 2;
        if (uVar3 == '-') {
          uVar9 = pOut->nUsed;
          if (uVar9 < pOut->nAlloc) {
            pOut->nUsed = uVar9 + 1;
            pOut->zBuf[uVar9] = '-';
          }
          else {
            jsonAppendCharExpand(pOut,'-');
          }
          goto LAB_001abac0;
        }
      }
      if (uVar15 < uVar17) {
        uVar11 = (ulong)uVar15;
        bVar18 = false;
        uVar9 = 0;
        do {
          bVar2 = (puVar16 + (uVar6 + i))[uVar11];
          if ((""[bVar2] & 8) == 0) {
            pOut->eErr = pOut->eErr | 2;
            break;
          }
          if (uVar9 >> 0x3c == 0) {
            uVar9 = uVar9 << 4 | (ulong)(((char)(bVar2 * '\x02') >> 7 & 9U) + bVar2 & 0xf);
          }
          else {
            bVar18 = true;
          }
          uVar11 = uVar11 + 1;
        } while (uVar17 != (u32)uVar11);
      }
      else {
        uVar9 = 0;
        bVar18 = false;
      }
      pcVar13 = "9.0e999";
      if (!bVar18) {
        pcVar13 = "%llu";
      }
      jsonPrintf(100,pOut,pcVar13,uVar9);
      if (uVar17 != 0) goto LAB_001abb87;
    }
    break;
  case 6:
    uVar11 = (ulong)local_44;
    if (uVar11 != 0) {
      puVar16 = puVar16 + (uVar6 + i);
      uVar15 = 0;
      if (*puVar16 == '-') {
        uVar12 = pOut->nUsed;
        if (uVar12 < pOut->nAlloc) {
          pOut->nUsed = uVar12 + 1;
          pOut->zBuf[uVar12] = '-';
        }
        else {
          jsonAppendCharExpand(pOut,'-');
        }
        uVar15 = 1;
      }
      uVar12 = (ulong)uVar15;
      local_40 = uVar9;
      if (puVar16[uVar12] == '.') {
        uVar4 = pOut->nUsed;
        if (uVar4 < pOut->nAlloc) {
          pOut->nUsed = uVar4 + 1;
          pOut->zBuf[uVar4] = '0';
        }
        else {
          jsonAppendCharExpand(pOut,'0');
        }
      }
      if (uVar15 < uVar17) {
        do {
          uVar3 = puVar16[uVar12];
          uVar9 = pOut->nUsed;
          if (uVar9 < pOut->nAlloc) {
            pOut->nUsed = uVar9 + 1;
            pOut->zBuf[uVar9] = uVar3;
          }
          else {
            jsonAppendCharExpand(pOut,uVar3);
          }
          if ((puVar16[uVar12] == '.') &&
             ((uVar11 - 1 == uVar12 || ((ulong)puVar16[uVar12 + 1] - 0x3a < 0xfffffffffffffff6)))) {
            uVar9 = pOut->nUsed;
            if (uVar9 < pOut->nAlloc) {
              pOut->nUsed = uVar9 + 1;
              pOut->zBuf[uVar9] = '0';
            }
            else {
              jsonAppendCharExpand(pOut,'0');
            }
          }
          uVar12 = uVar12 + 1;
        } while (uVar11 != uVar12);
      }
      i = (u32)local_40;
      if (uVar11 != 0) goto LAB_001abb87;
    }
    break;
  case 7:
  case 8:
    uVar9 = pOut->nUsed;
    if (uVar9 < pOut->nAlloc) {
      pOut->nUsed = uVar9 + 1;
      pOut->zBuf[uVar9] = '\"';
    }
    else {
      jsonAppendCharExpand(pOut,'\"');
    }
    jsonAppendRaw(pOut,(char *)(pParse->aBlob + (uVar6 + i)),local_44);
    uVar9 = pOut->nUsed;
    if (uVar9 < pOut->nAlloc) {
      pOut->nUsed = uVar9 + 1;
      pOut->zBuf[uVar9] = '\"';
      goto LAB_001abb87;
    }
    cVar8 = '\"';
    goto LAB_001ab767;
  case 9:
    uVar11 = pOut->nUsed;
    if (uVar11 < pOut->nAlloc) {
      pOut->nUsed = uVar11 + 1;
      pOut->zBuf[uVar11] = '\"';
      local_40 = uVar9;
    }
    else {
      local_40 = uVar9;
      jsonAppendCharExpand(pOut,'\"');
    }
    if (uVar17 != 0) {
      zIn = puVar16 + ((int)local_40 + uVar6);
      do {
        uVar9 = (ulong)uVar17;
        if ((ulong)*zIn == 0x27) {
LAB_001ab7c9:
          uVar11 = 0;
          do {
            if ((uVar9 + (uVar9 == 0)) - 1 == uVar11) {
              bVar18 = uVar11 + 1 < uVar9;
              uVar11 = (ulong)(uVar17 + (uVar17 == 0));
              goto LAB_001ab7fb;
            }
            lVar5 = uVar11 + 1;
            uVar11 = uVar11 + 1;
          } while (((ulong)zIn[lVar5] == 0x27) || (""[zIn[lVar5]] != '\0'));
          bVar18 = uVar11 < uVar9;
        }
        else {
          bVar18 = true;
          uVar11 = 0;
          if (""[*zIn] != '\0') goto LAB_001ab7c9;
        }
LAB_001ab7fb:
        uVar14 = (u32)uVar11;
        if (uVar14 != 0) {
          jsonAppendRawNZ(pOut,(char *)zIn,uVar14);
          if (!bVar18) break;
          zIn = zIn + (uVar11 & 0xffffffff);
          uVar17 = uVar17 - uVar14;
        }
        if (*zIn == 0x22) {
          jsonAppendRawNZ(pOut,"\\\"",2);
LAB_001ab875:
          zIn = zIn + 1;
          uVar17 = uVar17 - 1;
        }
        else {
          if ((char)*zIn < ' ') {
            if ((pOut->nUsed + 7 <= pOut->nAlloc) || (iVar7 = jsonStringGrow(pOut,7), iVar7 == 0)) {
              jsonAppendControlChar(pOut,*zIn);
              goto LAB_001ab875;
            }
            break;
          }
          if (uVar17 < 2) {
            pOut->eErr = pOut->eErr | 2;
            break;
          }
          bVar2 = zIn[1];
          if (bVar2 < 0x30) {
            if (bVar2 != 10) {
              if (bVar2 == 0xd) {
                if (uVar17 == 2) goto LAB_001ab95e;
                pbVar1 = zIn + 2;
                if (*pbVar1 == 10) {
                  zIn = zIn + 1;
                }
                uVar17 = uVar17 - (*pbVar1 == 10);
              }
              else {
                if (bVar2 != 0x27) goto LAB_001ab921;
                uVar9 = pOut->nUsed;
                if (uVar9 < pOut->nAlloc) {
                  pOut->nUsed = uVar9 + 1;
                  pOut->zBuf[uVar9] = '\'';
                }
                else {
                  jsonAppendCharExpand(pOut,'\'');
                }
              }
            }
          }
          else if (bVar2 < 0x78) {
            if (bVar2 == 0x30) {
              pcVar13 = "\\u0000";
LAB_001ab938:
              uVar14 = 6;
            }
            else {
              if (bVar2 == 0x76) {
                pcVar13 = "\\u0009";
                goto LAB_001ab938;
              }
LAB_001ab921:
              uVar14 = 2;
              pcVar13 = (char *)zIn;
            }
            jsonAppendRawNZ(pOut,pcVar13,uVar14);
          }
          else {
            if (bVar2 == 0x78) {
              if (3 < uVar17) {
                jsonAppendRawNZ(pOut,"\\u00",4);
                jsonAppendRawNZ(pOut,(char *)(zIn + 2),2);
                zIn = zIn + 2;
                uVar17 = uVar17 - 2;
                goto LAB_001ab9c1;
              }
            }
            else if (bVar2 != 0xe2) goto LAB_001ab921;
            pOut->eErr = pOut->eErr | 2;
LAB_001ab95e:
            uVar17 = 2;
          }
LAB_001ab9c1:
          zIn = zIn + 2;
          uVar17 = uVar17 - 2;
        }
      } while (uVar17 != 0);
    }
    uVar9 = pOut->nUsed;
    if (uVar9 < pOut->nAlloc) {
      pOut->nUsed = uVar9 + 1;
      pOut->zBuf[uVar9] = '\"';
    }
    else {
      jsonAppendCharExpand(pOut,'\"');
    }
    i = (u32)local_40;
    goto LAB_001abb87;
  case 10:
    jsonAppendString(pOut,(char *)(puVar16 + (uVar6 + i)),local_44);
    goto LAB_001abb87;
  case 0xb:
    uVar11 = pOut->nUsed;
    if (uVar11 < pOut->nAlloc) {
      pOut->nUsed = uVar11 + 1;
      pOut->zBuf[uVar11] = '[';
    }
    else {
      jsonAppendCharExpand(pOut,'[');
    }
    uVar17 = local_44;
    uVar14 = uVar6 + i;
    uVar15 = local_44 + uVar14;
    local_40 = uVar9;
    while ((uVar14 < uVar15 && (pOut->eErr == '\0'))) {
      uVar14 = jsonTranslateBlobToText(pParse,uVar14,pOut);
      uVar9 = pOut->nUsed;
      if (uVar9 < pOut->nAlloc) {
        pOut->nUsed = uVar9 + 1;
        pOut->zBuf[uVar9] = ',';
      }
      else {
        jsonAppendCharExpand(pOut,',');
      }
    }
    if (uVar15 < uVar14) {
      pOut->eErr = pOut->eErr | 2;
    }
    i = (u32)local_40;
    if ((uVar17 != 0) && (pOut->eErr == '\0')) {
      pOut->nUsed = pOut->nUsed - 1;
    }
    uVar9 = pOut->nUsed;
    if (uVar9 < pOut->nAlloc) {
      pOut->nUsed = uVar9 + 1;
      pOut->zBuf[uVar9] = ']';
      goto LAB_001abb87;
    }
    cVar8 = ']';
    goto LAB_001ab767;
  case 0xc:
    uVar11 = pOut->nUsed;
    if (uVar11 < pOut->nAlloc) {
      pOut->nUsed = uVar11 + 1;
      pOut->zBuf[uVar11] = '{';
    }
    else {
      jsonAppendCharExpand(pOut,'{');
    }
    uVar15 = uVar6 + i;
    local_38 = (ulong)local_44;
    uVar10 = local_44 + uVar15;
    bVar18 = false;
    local_40 = uVar9;
    while ((uVar15 < uVar10 && (pOut->eErr == '\0'))) {
      uVar15 = jsonTranslateBlobToText(pParse,uVar15,pOut);
      cVar8 = ',';
      if (!bVar18) {
        cVar8 = ':';
      }
      uVar9 = pOut->nUsed;
      if (uVar9 < pOut->nAlloc) {
        pOut->nUsed = uVar9 + 1;
        pOut->zBuf[uVar9] = cVar8;
      }
      else {
        jsonAppendCharExpand(pOut,cVar8);
      }
      bVar18 = (bool)(bVar18 ^ 1);
    }
    if ((uVar10 < uVar15) || (bVar18)) {
      pOut->eErr = pOut->eErr | 2;
    }
    if (((int)local_38 != 0) && (pOut->eErr == '\0')) {
      pOut->nUsed = pOut->nUsed - 1;
    }
    uVar9 = pOut->nUsed;
    i = (u32)local_40;
    if (uVar9 < pOut->nAlloc) {
      pOut->nUsed = uVar9 + 1;
      pOut->zBuf[uVar9] = '}';
      goto LAB_001abb87;
    }
    cVar8 = '}';
LAB_001ab767:
    jsonAppendCharExpand(pOut,cVar8);
    goto LAB_001abb87;
  }
  pOut->eErr = pOut->eErr | 2;
LAB_001abb87:
  return uVar6 + i + local_44;
}

Assistant:

static u32 jsonTranslateBlobToText(
  const JsonParse *pParse,       /* the complete parse of the JSON */
  u32 i,                         /* Start rendering at this index */
  JsonString *pOut               /* Write JSON here */
){
  u32 sz, n, j, iEnd;

  n = jsonbPayloadSize(pParse, i, &sz);
  if( n==0 ){
    pOut->eErr |= JSTRING_MALFORMED;
    return pParse->nBlob+1;
  }
  switch( pParse->aBlob[i] & 0x0f ){
    case JSONB_NULL: {
      jsonAppendRawNZ(pOut, "null", 4);
      return i+1;
    }
    case JSONB_TRUE: {
      jsonAppendRawNZ(pOut, "true", 4);
      return i+1;
    }
    case JSONB_FALSE: {
      jsonAppendRawNZ(pOut, "false", 5);
      return i+1;
    }
    case JSONB_INT:
    case JSONB_FLOAT: {
      if( sz==0 ) goto malformed_jsonb;
      jsonAppendRaw(pOut, (const char*)&pParse->aBlob[i+n], sz);
      break;
    }
    case JSONB_INT5: {  /* Integer literal in hexadecimal notation */
      u32 k = 2;
      sqlite3_uint64 u = 0;
      const char *zIn = (const char*)&pParse->aBlob[i+n];
      int bOverflow = 0;
      if( sz==0 ) goto malformed_jsonb;
      if( zIn[0]=='-' ){
        jsonAppendChar(pOut, '-');
        k++;
      }else if( zIn[0]=='+' ){
        k++;
      }
      for(; k<sz; k++){
        if( !sqlite3Isxdigit(zIn[k]) ){
          pOut->eErr |= JSTRING_MALFORMED;
          break;
        }else if( (u>>60)!=0 ){
          bOverflow = 1;
        }else{
          u = u*16 + sqlite3HexToInt(zIn[k]);
        }
      }
      jsonPrintf(100,pOut,bOverflow?"9.0e999":"%llu", u);
      break;
    }
    case JSONB_FLOAT5: { /* Float literal missing digits beside "." */
      u32 k = 0;
      const char *zIn = (const char*)&pParse->aBlob[i+n];
      if( sz==0 ) goto malformed_jsonb;
      if( zIn[0]=='-' ){
        jsonAppendChar(pOut, '-');
        k++;
      }
      if( zIn[k]=='.' ){
        jsonAppendChar(pOut, '0');
      }
      for(; k<sz; k++){
        jsonAppendChar(pOut, zIn[k]);
        if( zIn[k]=='.' && (k+1==sz || !sqlite3Isdigit(zIn[k+1])) ){
          jsonAppendChar(pOut, '0');
        }
      }
      break;
    }
    case JSONB_TEXT:
    case JSONB_TEXTJ: {
      jsonAppendChar(pOut, '"');
      jsonAppendRaw(pOut, (const char*)&pParse->aBlob[i+n], sz);
      jsonAppendChar(pOut, '"');
      break;
    }
    case JSONB_TEXT5: {
      const char *zIn;
      u32 k;
      u32 sz2 = sz;
      zIn = (const char*)&pParse->aBlob[i+n];
      jsonAppendChar(pOut, '"');
      while( sz2>0 ){
        for(k=0; k<sz2 && (jsonIsOk[(u8)zIn[k]] || zIn[k]=='\''); k++){}
        if( k>0 ){
          jsonAppendRawNZ(pOut, zIn, k);
          if( k>=sz2 ){
            break;
          }
          zIn += k;
          sz2 -= k;
        }
        if( zIn[0]=='"' ){
          jsonAppendRawNZ(pOut, "\\\"", 2);
          zIn++;
          sz2--;
          continue;
        }
        if( zIn[0]<=0x1f ){
          if( pOut->nUsed+7>pOut->nAlloc && jsonStringGrow(pOut,7) ) break;
          jsonAppendControlChar(pOut, zIn[0]);
          zIn++;
          sz2--;
          continue;
        }
        assert( zIn[0]=='\\' );
        assert( sz2>=1 );
        if( sz2<2 ){
          pOut->eErr |= JSTRING_MALFORMED;
          break;
        }
        switch( (u8)zIn[1] ){
          case '\'':
            jsonAppendChar(pOut, '\'');
            break;
          case 'v':
            jsonAppendRawNZ(pOut, "\\u0009", 6);
            break;
          case 'x':
            if( sz2<4 ){
              pOut->eErr |= JSTRING_MALFORMED;
              sz2 = 2;
              break;
            }
            jsonAppendRawNZ(pOut, "\\u00", 4);
            jsonAppendRawNZ(pOut, &zIn[2], 2);
            zIn += 2;
            sz2 -= 2;
            break;
          case '0':
            jsonAppendRawNZ(pOut, "\\u0000", 6);
            break;
          case '\r':
            if( sz2>2 && zIn[2]=='\n' ){
              zIn++;
              sz2--;
            }
            break;
          case '\n':
            break;
          case 0xe2:
            /* '\' followed by either U+2028 or U+2029 is ignored as
            ** whitespace.  Not that in UTF8, U+2028 is 0xe2 0x80 0x29.
            ** U+2029 is the same except for the last byte */
            if( sz2<4
             || 0x80!=(u8)zIn[2]
             || (0xa8!=(u8)zIn[3] && 0xa9!=(u8)zIn[3])
            ){
              pOut->eErr |= JSTRING_MALFORMED;
              sz2 = 2;
              break;
            }
            zIn += 2;
            sz2 -= 2;
            break;
          default:
            jsonAppendRawNZ(pOut, zIn, 2);
            break;
        }
        assert( sz2>=2 );
        zIn += 2;
        sz2 -= 2;
      }
      jsonAppendChar(pOut, '"');
      break;
    }
    case JSONB_TEXTRAW: {
      jsonAppendString(pOut, (const char*)&pParse->aBlob[i+n], sz);
      break;
    }
    case JSONB_ARRAY: {
      jsonAppendChar(pOut, '[');
      j = i+n;
      iEnd = j+sz;
      while( j<iEnd && pOut->eErr==0 ){
        j = jsonTranslateBlobToText(pParse, j, pOut);
        jsonAppendChar(pOut, ',');
      }
      if( j>iEnd ) pOut->eErr |= JSTRING_MALFORMED;
      if( sz>0 ) jsonStringTrimOneChar(pOut);
      jsonAppendChar(pOut, ']');
      break;
    }
    case JSONB_OBJECT: {
      int x = 0;
      jsonAppendChar(pOut, '{');
      j = i+n;
      iEnd = j+sz;
      while( j<iEnd && pOut->eErr==0 ){
        j = jsonTranslateBlobToText(pParse, j, pOut);
        jsonAppendChar(pOut, (x++ & 1) ? ',' : ':');
      }
      if( (x & 1)!=0 || j>iEnd ) pOut->eErr |= JSTRING_MALFORMED;
      if( sz>0 ) jsonStringTrimOneChar(pOut);
      jsonAppendChar(pOut, '}');
      break;
    }

    default: {
      malformed_jsonb:
      pOut->eErr |= JSTRING_MALFORMED;
      break;
    }
  }
  return i+n+sz;
}